

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeEventGetSignalScope(ze_event_handle_t hEvent,ze_event_scope_flags_t *pSignalScope)

{
  ze_pfnEventGetSignalScope_t pfnGetSignalScope;
  dditable_t *dditable;
  ze_result_t result;
  ze_event_scope_flags_t *pSignalScope_local;
  ze_event_handle_t hEvent_local;
  
  if (*(code **)(*(long *)(hEvent + 8) + 0x4e0) == (code *)0x0) {
    hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hEvent_local._4_4_ =
         (**(code **)(*(long *)(hEvent + 8) + 0x4e0))(*(undefined8 *)hEvent,pSignalScope);
  }
  return hEvent_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventGetSignalScope(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_event_scope_flags_t* pSignalScope            ///< [out] signal event scope. This is the scope of relevant cache
                                                        ///< hierarchies that are flushed on a signal action before the event is
                                                        ///< triggered. May be 0 or a valid combination of ::ze_event_scope_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_object_t*>( hEvent )->dditable;
        auto pfnGetSignalScope = dditable->ze.Event.pfnGetSignalScope;
        if( nullptr == pfnGetSignalScope )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // forward to device-driver
        result = pfnGetSignalScope( hEvent, pSignalScope );

        return result;
    }